

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryInputGeometryShaderTests.cpp
# Opt level: O2

void __thiscall
vkt::geometry::anon_unknown_2::GeometryExpanderRenderTest::GeometryExpanderRenderTest
          (GeometryExpanderRenderTest *this,TestContext *testCtx,PrimitiveTestSpec *inputPrimitives)

{
  allocator<char> local_5a;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,inputPrimitives->name,&local_59);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,inputPrimitives->name,&local_5a);
  TestCase::TestCase(&this->super_TestCase,testCtx,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_00c22990;
  this->m_primitiveType = inputPrimitives->primitiveType;
  this->m_outputType = inputPrimitives->outputType;
  return;
}

Assistant:

GeometryExpanderRenderTest::GeometryExpanderRenderTest (TestContext& testCtx, const PrimitiveTestSpec& inputPrimitives)
	: TestCase			(testCtx, inputPrimitives.name, inputPrimitives.name)
	, m_primitiveType	(inputPrimitives.primitiveType)
	, m_outputType		(inputPrimitives.outputType)
{

}